

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O0

void __thiscall SpanList::pushBack(SpanList *this,Span *pSpan)

{
  Span *pSpan_local;
  SpanList *this_local;
  
  if (this->list == (Span *)0x0) {
    this->list = pSpan;
    this->list->prev = this->list;
    this->list->next = this->list;
  }
  else {
    this->list->prev->next = pSpan;
    pSpan->prev = this->list->prev;
    pSpan->next = this->list;
    this->list->prev = pSpan;
  }
  return;
}

Assistant:

void SpanList::pushBack(Span *pSpan) {
  // 先判断是否为空
  if (list == nullptr) {
    list = pSpan;
    list->prev = list;
    list->next = list;
  } else {
    list->prev->next = pSpan;
    pSpan->prev = list->prev;
    pSpan->next = list;
    list->prev = pSpan;
  }
}